

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileString.cpp
# Opt level: O0

void __thiscall Js::StringProfiler::PrintAll(StringProfiler *this)

{
  anon_class_24_3_24c8c3db_for_fn fn;
  anon_class_40_5_41842f85_for_fn fn_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint *puVar5;
  undefined8 in_R8;
  StringMetrics metrics_00;
  uint local_94;
  uint local_90;
  uint totalOther;
  uint totalCompoundString;
  uint totalBufString;
  uint totalConcatTree;
  uint totalConcatenations;
  uint local_78;
  StringMetrics local_70;
  undefined1 local_64 [8];
  StringMetrics metrics;
  uint length;
  uint i;
  uint maxLength;
  StringMetrics cumulative;
  uint local_24;
  undefined1 local_20 [4];
  uint totalStringCount;
  HistogramIndex index;
  StringProfiler *this_local;
  
  index._8_8_ = this;
  Output::Print(L"=============================================================\n");
  Output::Print(L"String Statistics\n");
  Output::Print(L"-------------------------------------------------------------\n");
  Output::Print(L"    Length 7bit ASCII 8bit ASCII    Unicode      Total %%Total\n");
  Output::Print(L" --------- ---------- ---------- ---------- ---------- ------\n");
  uVar2 = JsUtil::
          BaseDictionary<unsigned_int,_Js::StringProfiler::StringMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::Count(&this->stringLengthMetrics);
  HistogramIndex::HistogramIndex((HistogramIndex *)local_20,&this->allocator,uVar2);
  local_24 = 0;
  fn.index = (HistogramIndex *)local_20;
  fn.this = this;
  fn.totalStringCount = &local_24;
  cumulative._4_8_ = this;
  JsUtil::
  BaseDictionary<unsigned_int,Js::StringProfiler::StringMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::Map<Js::StringProfiler::PrintAll()::__0>
            ((BaseDictionary<unsigned_int,Js::StringProfiler::StringMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)&this->stringLengthMetrics,fn);
  HistogramIndex::SortDescending((HistogramIndex *)local_20);
  memset(&i,0,0xc);
  length = 0;
  for (metrics.countUnicode = 0; uVar2 = metrics.countUnicode,
      uVar3 = HistogramIndex::Count((HistogramIndex *)local_20), uVar2 != uVar3;
      metrics.countUnicode = metrics.countUnicode + 1) {
    metrics.count8BitASCII = HistogramIndex::Get((HistogramIndex *)local_20,metrics.countUnicode);
    bVar1 = JsUtil::
            BaseDictionary<unsigned_int,_Js::StringProfiler::StringMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetValue<unsigned_int>
                      (&this->stringLengthMetrics,&metrics.count8BitASCII,(StringMetrics *)local_64)
    ;
    if (bVar1) {
      local_70.count7BitASCII = local_64._0_4_;
      local_70.count8BitASCII = local_64._4_4_;
      local_70.countUnicode = metrics.count7BitASCII;
      totalConcatTree = local_64._0_4_;
      totalConcatenations = local_64._4_4_;
      local_78 = metrics.count7BitASCII;
      metrics_00.count8BitASCII = 0;
      metrics_00.count7BitASCII = metrics.count7BitASCII;
      metrics_00.countUnicode = local_24;
      PrintOne((StringProfiler *)(ulong)metrics.count8BitASCII,local_64._0_4_,metrics_00,(uint)in_R8
              );
      StringMetrics::Accumulate((StringMetrics *)&i,(StringMetrics *)local_64);
      puVar5 = max<unsigned_int>(&length,&metrics.count8BitASCII);
      length = *puVar5;
    }
  }
  Output::Print(L"-------------------------------------------------------------\n");
  uVar2 = StringMetrics::Total((StringMetrics *)&i);
  Output::Print(L"    Totals %10u %10u %10u %10u (100%%)\n",(ulong)i,(ulong)maxLength,
                (ulong)cumulative.count7BitASCII,(ulong)uVar2);
  if (this->discardedWrongThread != 0) {
    Output::Print(L"WARNING: %u strings were not counted because they were allocated on a background thread\n"
                  ,(ulong)this->discardedWrongThread);
  }
  Output::Print(L"\n");
  Output::Print(L"Max string length is %u chars\n",(ulong)length);
  Output::Print(L"%u empty strings (Literals or BufferString) were requested\n",
                (ulong)this->emptyStrings);
  Output::Print(L"%u single char strings (Literals or BufferString) were requested\n",
                (ulong)this->singleCharStrings);
  if (this->embeddedNULStrings == 0) {
    Output::Print(L"No embedded NULs were detected\n");
  }
  else {
    Output::Print(L"Embedded NULs: %u NULs in %u strings\n",(ulong)this->embeddedNULChars,
                  (ulong)this->embeddedNULStrings);
  }
  Output::Print(L"\n");
  iVar4 = JsUtil::
          BaseDictionary<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::Count(&this->stringConcatMetrics);
  if (iVar4 == 0) {
    Output::Print(L"No string concatenations were performed\n");
  }
  else {
    Output::Print(L"String concatenations (Strings %u chars or longer are treated as \"Large\")\n",
                  0x14);
    Output::Print(L"   LHS +  RHS  SB    Concat   Buf  Other  Total\n");
    Output::Print(L"------ ------ ------ ------ ------ ------ ------\n");
    totalBufString = 0;
    totalCompoundString = 0;
    totalOther = 0;
    local_90 = 0;
    local_94 = 0;
    fn_00.totalConcatTree = &totalCompoundString;
    fn_00.totalConcatenations = &totalBufString;
    fn_00.totalBufString = &totalOther;
    fn_00.totalCompoundString = &local_90;
    fn_00.totalOther = &local_94;
    JsUtil::
    BaseDictionary<Js::StringProfiler::UintUintPair,Js::StringProfiler::ConcatMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::Map<Js::StringProfiler::PrintAll()::__1>
              ((BaseDictionary<Js::StringProfiler::UintUintPair,Js::StringProfiler::ConcatMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)&this->stringConcatMetrics,fn_00);
    Output::Print(L"-------------------------------------------------------\n");
    Output::Print(L"Total %6u %6u %6u %6u %6u\n",(ulong)totalBufString,(ulong)local_90,
                  (ulong)totalCompoundString,(ulong)totalOther,(ulong)local_94);
  }
  Output::Flush();
  return;
}

Assistant:

void StringProfiler::PrintAll()
    {
        Output::Print(_u("=============================================================\n"));
        Output::Print(_u("String Statistics\n"));
        Output::Print(_u("-------------------------------------------------------------\n"));
        Output::Print(_u("    Length 7bit ASCII 8bit ASCII    Unicode      Total %%Total\n"));
        Output::Print(_u(" --------- ---------- ---------- ---------- ---------- ------\n"));

        // Build an index for printing the histogram in descending order
        HistogramIndex index(&allocator, stringLengthMetrics.Count());
        uint totalStringCount = 0;
        stringLengthMetrics.Map([this, &index, &totalStringCount](unsigned int len, StringMetrics metrics)
        {
            uint lengthTotal = metrics.Total();
            index.Add(len, lengthTotal);
            totalStringCount += lengthTotal;
        });
        index.SortDescending();

        StringMetrics cumulative = {};
        uint maxLength = 0;

        for(uint i = 0; i != index.Count(); ++i )
        {
            uint length = index.Get(i);

            // UintHashMap::Lookup doesn't work with value-types (it returns NULL
            // on error), so use TryGetValue instead.
            StringMetrics metrics;
            if( stringLengthMetrics.TryGetValue(length, &metrics) )
            {
                PrintOne( length, metrics, totalStringCount );

                cumulative.Accumulate(metrics);
                maxLength = max( maxLength, length );
            }
        }

        Output::Print(_u("-------------------------------------------------------------\n"));
        Output::Print(_u("    Totals %10u %10u %10u %10u (100%%)\n"),
            cumulative.count7BitASCII,
            cumulative.count8BitASCII,
            cumulative.countUnicode,
            cumulative.Total() );

        if(discardedWrongThread>0)
        {
            Output::Print(_u("WARNING: %u strings were not counted because they were allocated on a background thread\n"),discardedWrongThread);
        }
        Output::Print(_u("\n"));
        Output::Print(_u("Max string length is %u chars\n"), maxLength);
        Output::Print(_u("%u empty strings (Literals or BufferString) were requested\n"), emptyStrings);
        Output::Print(_u("%u single char strings (Literals or BufferString) were requested\n"), singleCharStrings);
        if( this->embeddedNULStrings == 0 )
        {
            Output::Print(_u("No embedded NULs were detected\n"));
        }
        else
        {
            Output::Print(_u("Embedded NULs: %u NULs in %u strings\n"), this->embeddedNULChars, this->embeddedNULStrings);
        }
        Output::Print(_u("\n"));

        if(stringConcatMetrics.Count() == 0)
        {
            Output::Print(_u("No string concatenations were performed\n"));
        }
        else
        {
            Output::Print(_u("String concatenations (Strings %u chars or longer are treated as \"Large\")\n"), k_MaxConcatLength);
            Output::Print(_u("   LHS +  RHS  SB    Concat   Buf  Other  Total\n"));
            Output::Print(_u("------ ------ ------ ------ ------ ------ ------\n"));

            uint totalConcatenations = 0;
            uint totalConcatTree = 0;
            uint totalBufString = 0;
            uint totalCompoundString = 0;
            uint totalOther = 0;
            stringConcatMetrics.Map([&](UintUintPair const& key, const ConcatMetrics& metrics)
            {
                PrintOneConcat(key, metrics);
                totalConcatenations += metrics.Total();
                totalConcatTree += metrics.concatTreeCount;
                totalBufString += metrics.bufferStringBuilderCount;
                totalCompoundString += metrics.compoundStringCount;
                totalOther += metrics.unknownCount;
            }
            );
            Output::Print(_u("-------------------------------------------------------\n"));
            Output::Print(_u("Total %6u %6u %6u %6u %6u\n"), totalConcatenations, totalCompoundString, totalConcatTree, totalBufString, totalOther);
        }

        Output::Flush();
    }